

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.h
# Opt level: O0

proxy * __thiscall
YAML::detail::iterator_base<YAML::detail::iterator_value>::operator->
          (iterator_base<YAML::detail::iterator_value> *this)

{
  iterator_value *in_RDI;
  iterator_base<YAML::detail::iterator_value> *in_stack_00000068;
  iterator_value *this_00;
  
  this_00 = in_RDI;
  operator*(in_stack_00000068);
  proxy::proxy((proxy *)this_00,in_RDI);
  iterator_value::~iterator_value(this_00);
  return (proxy *)in_RDI;
}

Assistant:

proxy operator->() const { return proxy(**this); }